

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

Id __thiscall
dxil_spv::Converter::Impl::get_id_for_constant(Impl *this,Constant *constant,uint forced_width)

{
  uint uVar1;
  int iVar2;
  TypeID TVar3;
  Id IVar4;
  ValueKind VVar5;
  uint uVar6;
  uint uVar7;
  Builder *this_00;
  Type *pTVar8;
  Value *pVVar9;
  ConstantAggregate *this_01;
  Constant *pCVar10;
  APFloat *pAVar11;
  APInt *pAVar12;
  ConstantDataArray *this_02;
  uint64_t uVar13;
  ConstantDataVector *this_03;
  float fVar14;
  double d;
  Vector<spv::Id> constituents;
  Id local_5c;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_58;
  Id local_3c;
  Builder *local_38;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  pTVar8 = LLVMBC::Value::getType(&constant->super_Value);
  TVar3 = LLVMBC::Type::getTypeID(pTVar8);
  IVar4 = 0;
  switch(TVar3) {
  case HalfTyID:
    pCVar10 = &LLVMBC::cast<LLVMBC::ConstantFP>(&constant->super_Value)->super_Constant;
    pAVar11 = LLVMBC::Constant::getValueAPF(pCVar10);
    local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._0_16_ = LLVMBC::APFloat::bitcastToAPInt(pAVar11);
    uVar13 = LLVMBC::APInt::getZExtValue((APInt *)&local_58);
    if (((this->execution_mode_meta).native_16bit_operations != false) ||
       (((this->options).min_precision_prefer_native_16bit & 1U) != 0)) {
      IVar4 = spv::Builder::makeFloat16Constant(this_00,(uint16_t)uVar13,false);
      return IVar4;
    }
    iVar2 = (int)((uVar13 & 0xffff) >> 0xf);
    uVar7 = (uint)(uVar13 >> 10) & 0x1f;
    uVar6 = (uint)uVar13 & 0x3ff;
    if (uVar7 == 0x1f) {
      uVar6 = iVar2 << 0x1f;
      if ((uVar13 & 0x3ff) != 0) {
        uVar6 = uVar6 | (int)(uVar13 & 0xffff) << 0xd;
      }
      fVar14 = (float)(uVar6 | 0x7f800000);
    }
    else {
      if ((uVar13 >> 10 & 0x1f) == 0) {
        if ((uVar13 & 0x3ff) == 0) {
          fVar14 = (float)(iVar2 << 0x1f);
          goto LAB_0011b4f2;
        }
        uVar1 = 0x1f;
        if ((uVar13 & 0x3ff) != 0) {
          for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        uVar7 = (uVar1 ^ 0xffffffe0) + 0x17;
        uVar6 = uVar6 << (~(byte)uVar1 + 0xb & 0x1f) & 0x1fffbfe;
      }
      fVar14 = (float)(uVar7 * 0x800000 + 0x38000000 | iVar2 << 0x1f | uVar6 << 0xd);
    }
LAB_0011b4f2:
    IVar4 = spv::Builder::makeFloatConstant(this_00,fVar14,false);
    break;
  case FloatTyID:
    pCVar10 = &LLVMBC::cast<LLVMBC::ConstantFP>(&constant->super_Value)->super_Constant;
    pAVar11 = LLVMBC::Constant::getValueAPF(pCVar10);
    fVar14 = LLVMBC::APFloat::convertToFloat(pAVar11);
    IVar4 = spv::Builder::makeFloatConstant(this_00,fVar14,false);
    return IVar4;
  case DoubleTyID:
    pCVar10 = &LLVMBC::cast<LLVMBC::ConstantFP>(&constant->super_Value)->super_Constant;
    pAVar11 = LLVMBC::Constant::getValueAPF(pCVar10);
    d = LLVMBC::APFloat::convertToDouble(pAVar11);
    IVar4 = spv::Builder::makeDoubleConstant(this_00,d,false);
    return IVar4;
  case IntegerTyID:
    if (forced_width == 0) {
      pTVar8 = LLVMBC::Value::getType(&constant->super_Value);
      forced_width = LLVMBC::Type::getIntegerBitWidth(pTVar8);
    }
    uVar6 = physical_integer_bit_width(forced_width);
    if ((int)uVar6 < 0x20) {
      if (uVar6 == 1) {
        pAVar12 = LLVMBC::Constant::getUniqueInteger(constant);
        uVar13 = LLVMBC::APInt::getZExtValue(pAVar12);
        IVar4 = spv::Builder::makeBoolConstant(this_00,uVar13 != 0,false);
        return IVar4;
      }
      if (uVar6 == 0x10) {
        pAVar12 = LLVMBC::Constant::getUniqueInteger(constant);
        uVar13 = LLVMBC::APInt::getZExtValue(pAVar12);
        IVar4 = spv::Builder::makeIntegerType(this_00,0x10,false);
        uVar6 = (uint)uVar13 & 0xffff;
LAB_0011b4c4:
        IVar4 = spv::Builder::makeIntConstant(this_00,IVar4,uVar6,false);
        return IVar4;
      }
    }
    else {
      if (uVar6 == 0x20) {
        pAVar12 = LLVMBC::Constant::getUniqueInteger(constant);
        uVar13 = LLVMBC::APInt::getZExtValue(pAVar12);
        IVar4 = spv::Builder::makeIntegerType(this_00,0x20,false);
        uVar6 = (uint)uVar13;
        goto LAB_0011b4c4;
      }
      if (uVar6 == 0x40) {
        pAVar12 = LLVMBC::Constant::getUniqueInteger(constant);
        uVar13 = LLVMBC::APInt::getZExtValue(pAVar12);
        IVar4 = spv::Builder::makeIntegerType(this_00,0x40,false);
        IVar4 = spv::Builder::makeInt64Constant(this_00,IVar4,uVar13,false);
        return IVar4;
      }
    }
    break;
  case ArrayTyID:
  case StructTyID:
  case VectorTyID:
    local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    pTVar8 = LLVMBC::Value::getType(&constant->super_Value);
    IVar4 = get_type_id(this,pTVar8,0);
    pVVar9 = LLVMBC::Internal::resolve_proxy(&constant->super_Value);
    VVar5 = LLVMBC::Value::get_value_kind(pVVar9);
    if (VVar5 == ConstantAggregateZero) {
      IVar4 = spv::Builder::makeNullConstant(this_00,IVar4);
    }
    else {
      local_38 = this_00;
      this_01 = (ConstantAggregate *)LLVMBC::Internal::resolve_proxy(&constant->super_Value);
      VVar5 = LLVMBC::Value::get_value_kind((Value *)this_01);
      local_3c = IVar4;
      if (VVar5 == ConstantAggregate) {
        uVar6 = LLVMBC::ConstantAggregate::getNumOperands(this_01);
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                  (&local_58,(ulong)uVar6);
        uVar6 = LLVMBC::ConstantAggregate::getNumOperands(this_01);
        if (uVar6 != 0) {
          uVar6 = 0;
          do {
            pCVar10 = LLVMBC::ConstantAggregate::getOperand(this_01,uVar6);
            if (pCVar10 == (Constant *)0x0) {
LAB_0011b076:
              local_5c = get_id_for_constant(this,pCVar10,0);
            }
            else {
              pVVar9 = LLVMBC::Internal::resolve_proxy(&pCVar10->super_Value);
              VVar5 = LLVMBC::Value::get_value_kind(pVVar9);
              if (VVar5 != Undef) goto LAB_0011b076;
              local_5c = get_id_for_undef_constant(this,(UndefValue *)pVVar9);
            }
            if (local_58.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_58.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
            }
            else {
              *local_58.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = local_5c;
              local_58.
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_58.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar6 = uVar6 + 1;
            uVar7 = LLVMBC::ConstantAggregate::getNumOperands(this_01);
          } while (uVar6 < uVar7);
        }
      }
      else {
        this_02 = (ConstantDataArray *)LLVMBC::Internal::resolve_proxy(&constant->super_Value);
        VVar5 = LLVMBC::Value::get_value_kind((Value *)this_02);
        if (VVar5 == ConstantDataArray) {
          pTVar8 = LLVMBC::Value::getType((Value *)this_02);
          uVar13 = LLVMBC::Type::getArrayNumElements(pTVar8);
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                    (&local_58,uVar13);
          uVar6 = LLVMBC::ConstantDataArray::getNumElements(this_02);
          if (uVar6 != 0) {
            uVar6 = 0;
            do {
              pCVar10 = LLVMBC::ConstantDataArray::getElementAsConstant(this_02,uVar6);
              if (pCVar10 == (Constant *)0x0) {
LAB_0011b2b4:
                local_5c = get_id_for_constant(this,pCVar10,0);
              }
              else {
                pVVar9 = LLVMBC::Internal::resolve_proxy(&pCVar10->super_Value);
                VVar5 = LLVMBC::Value::get_value_kind(pVVar9);
                if (VVar5 != Undef) goto LAB_0011b2b4;
                local_5c = get_id_for_undef_constant(this,(UndefValue *)pVVar9);
              }
              if (local_58.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_58.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
              }
              else {
                *local_58.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_5c;
                local_58.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_58.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              uVar6 = uVar6 + 1;
              uVar7 = LLVMBC::ConstantDataArray::getNumElements(this_02);
            } while (uVar6 < uVar7);
          }
        }
        else {
          this_03 = (ConstantDataVector *)LLVMBC::Internal::resolve_proxy(&constant->super_Value);
          VVar5 = LLVMBC::Value::get_value_kind((Value *)this_03);
          if (VVar5 != ConstantDataVector) {
            return 0;
          }
          pTVar8 = LLVMBC::Value::getType((Value *)this_03);
          uVar6 = LLVMBC::Type::getVectorNumElements(pTVar8);
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                    (&local_58,(ulong)uVar6);
          uVar6 = LLVMBC::ConstantDataVector::getNumElements(this_03);
          if (uVar6 != 0) {
            uVar6 = 0;
            do {
              pCVar10 = LLVMBC::ConstantDataVector::getElementAsConstant(this_03,uVar6);
              if (pCVar10 == (Constant *)0x0) {
LAB_0011b3f2:
                local_5c = get_id_for_constant(this,pCVar10,0);
              }
              else {
                pVVar9 = LLVMBC::Internal::resolve_proxy(&pCVar10->super_Value);
                VVar5 = LLVMBC::Value::get_value_kind(pVVar9);
                if (VVar5 != Undef) goto LAB_0011b3f2;
                local_5c = get_id_for_undef_constant(this,(UndefValue *)pVVar9);
              }
              if (local_58.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_58.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_5c);
              }
              else {
                *local_58.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_5c;
                local_58.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_58.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              uVar6 = uVar6 + 1;
              uVar7 = LLVMBC::ConstantDataVector::getNumElements(this_03);
            } while (uVar6 < uVar7);
          }
        }
      }
      IVar4 = spv::Builder::makeCompositeConstant(local_38,local_3c,&local_58,false);
      if ((Type *)local_58.
                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (Type *)0x0) {
        free_in_thread(local_58.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return IVar4;
}

Assistant:

spv::Id Converter::Impl::get_id_for_constant(const llvm::Constant *constant, unsigned forced_width)
{
	auto &builder = spirv_module.get_builder();

	switch (constant->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		auto f16 = uint16_t(fp->getValueAPF().bitcastToAPInt().getZExtValue());

		if (support_native_fp16_operations())
			return builder.makeFloat16Constant(f16);
		else
			return builder.makeFloatConstant(half_to_float(f16));
	}

	case llvm::Type::TypeID::FloatTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		return builder.makeFloatConstant(fp->getValueAPF().convertToFloat());
	}

	case llvm::Type::TypeID::DoubleTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		return builder.makeDoubleConstant(fp->getValueAPF().convertToDouble());
	}

	case llvm::Type::TypeID::IntegerTyID:
	{
		unsigned integer_width = forced_width ? forced_width : constant->getType()->getIntegerBitWidth();
		int physical_width = physical_integer_bit_width(integer_width);
		switch (physical_width)
		{
		case 1:
			return builder.makeBoolConstant(constant->getUniqueInteger().getZExtValue() != 0);

		case 16:
			return builder.makeUint16Constant(constant->getUniqueInteger().getZExtValue());

		case 32:
			return builder.makeUintConstant(constant->getUniqueInteger().getZExtValue());

		case 64:
			return builder.makeUint64Constant(constant->getUniqueInteger().getZExtValue());

		default:
			return 0;
		}
	}

	case llvm::Type::TypeID::VectorTyID:
	case llvm::Type::TypeID::ArrayTyID:
	case llvm::Type::TypeID::StructTyID:
	{
		Vector<spv::Id> constituents;
		spv::Id type_id = get_type_id(constant->getType());

		if (llvm::isa<llvm::ConstantAggregateZero>(constant))
		{
			return builder.makeNullConstant(type_id);
		}
		else if (auto *agg = llvm::dyn_cast<llvm::ConstantAggregate>(constant))
		{
			constituents.reserve(agg->getNumOperands());
			for (unsigned i = 0; i < agg->getNumOperands(); i++)
			{
				llvm::Constant *c = agg->getOperand(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else if (auto *array = llvm::dyn_cast<llvm::ConstantDataArray>(constant))
		{
			constituents.reserve(array->getType()->getArrayNumElements());
			for (unsigned i = 0; i < array->getNumElements(); i++)
			{
				llvm::Constant *c = array->getElementAsConstant(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else if (auto *vec = llvm::dyn_cast<llvm::ConstantDataVector>(constant))
		{
			constituents.reserve(vec->getType()->getVectorNumElements());
			for (unsigned i = 0; i < vec->getNumElements(); i++)
			{
				llvm::Constant *c = vec->getElementAsConstant(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else
			return 0;

		return builder.makeCompositeConstant(type_id, constituents);
	}

	default:
		return 0;
	}
}